

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O3

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  compiler_token_type cVar3;
  char **ppcVar4;
  
  ppcVar4 = eat_ws_<char_const*>(this,begin,end);
  if (*ppcVar4 == end) {
    return token_end_of_pattern;
  }
  pbVar2 = (byte *)*begin;
  bVar1 = *pbVar2;
  cVar3 = token_invalid_quantifier;
  if (bVar1 < 0x3f) {
    switch(bVar1) {
    case 0x24:
      *begin = (char *)(pbVar2 + 1);
      cVar3 = token_assert_end_line;
      break;
    default:
      goto switchD_00125bd6_caseD_25;
    case 0x28:
      *begin = (char *)(pbVar2 + 1);
      cVar3 = token_group_begin;
      break;
    case 0x29:
      *begin = (char *)(pbVar2 + 1);
      cVar3 = token_group_end;
      break;
    case 0x2a:
    case 0x2b:
      break;
    case 0x2e:
      *begin = (char *)(pbVar2 + 1);
      cVar3 = token_any;
    }
  }
  else {
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x3f) {
        return token_invalid_quantifier;
      }
      if (bVar1 == 0x5b) {
        *begin = (char *)(pbVar2 + 1);
        return token_charset_begin;
      }
    }
    else {
      if (bVar1 == 0x7c) {
        *begin = (char *)(pbVar2 + 1);
        return token_alternate;
      }
      if (bVar1 == 0x5e) {
        *begin = (char *)(pbVar2 + 1);
        return token_assert_begin_line;
      }
      if (bVar1 == 0x5c) {
        *begin = (char *)(pbVar2 + 1);
        cVar3 = get_escape_token<char_const*>(this,begin,end);
        return cVar3;
      }
    }
switchD_00125bd6_caseD_25:
    cVar3 = token_literal;
  }
  return cVar3;
}

Assistant:

regex_constants::compiler_token_type get_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) == end)
        {
            return regex_constants::token_end_of_pattern;
        }

        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '\\'): return this->get_escape_token(++begin, end);
        case BOOST_XPR_CHAR_(char_type, '.'): ++begin; return token_any;
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_assert_begin_line;
        case BOOST_XPR_CHAR_(char_type, '$'): ++begin; return token_assert_end_line;
        case BOOST_XPR_CHAR_(char_type, '('): ++begin; return token_group_begin;
        case BOOST_XPR_CHAR_(char_type, ')'): ++begin; return token_group_end;
        case BOOST_XPR_CHAR_(char_type, '|'): ++begin; return token_alternate;
        case BOOST_XPR_CHAR_(char_type, '['): ++begin; return token_charset_begin;

        case BOOST_XPR_CHAR_(char_type, '*'):
        case BOOST_XPR_CHAR_(char_type, '+'):
        case BOOST_XPR_CHAR_(char_type, '?'):
            return token_invalid_quantifier;

        case BOOST_XPR_CHAR_(char_type, ']'):
        case BOOST_XPR_CHAR_(char_type, '{'):
        default:
            return token_literal;
        }
    }